

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Vec_IntRemap(Vec_Int_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < p->nSize; lVar2 = lVar2 + 1) {
    iVar1 = Vec_IntEntry(vMap,p->pArray[lVar2]);
    p->pArray[lVar2] = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_IntRemap( Vec_Int_t * p, Vec_Int_t * vMap )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Vec_IntEntry(vMap, p->pArray[i]);
}